

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

void __thiscall
LinkedObjectFile::push_back_word_to_segment(LinkedObjectFile *this,uint32_t word,int segment)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  uint *in_RDI;
  vector<LinkedWord,_std::allocator<LinkedWord>_> *unaff_retaddr;
  size_type in_stack_ffffffffffffffe8;
  
  std::
  vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
        *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8);
  std::vector<LinkedWord,std::allocator<LinkedWord>>::emplace_back<unsigned_int&>
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void LinkedObjectFile::push_back_word_to_segment(uint32_t word, int segment) {
  words_by_seg.at(segment).emplace_back(word);
}